

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O2

REF_STATUS
ref_inflate_rail_node
          (REF_GRID ref_grid,REF_DICT faceids,REF_INT node,REF_BOOL *in_rail,REF_INT *ind)

{
  REF_CELL ref_cell;
  uint uVar1;
  REF_BOOL RVar2;
  undefined8 uVar3;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  REF_INT n_id;
  REF_INT ids [4];
  
  ref_cell = ref_grid->cell[3];
  n_id = 0;
  *in_rail = 0;
  *ind = -1;
  uVar1 = ref_cell_id_list_around(ref_cell,node,4,&n_id,ids);
  if (uVar1 == 0) {
    uVar5 = 0;
    for (lVar6 = 0; lVar6 < n_id; lVar6 = lVar6 + 1) {
      RVar2 = ref_dict_has_key(faceids,ids[lVar6]);
      if (RVar2 != 0) {
        uVar1 = ref_dict_location(faceids,ids[lVar6],ind);
        if (uVar1 != 0) {
          pcVar4 = "faceid loc";
          uVar3 = 0x240;
          goto LAB_00189aec;
        }
        uVar5 = uVar5 + 1;
      }
    }
    if ((int)uVar5 < 1) {
      pcVar4 = "no tris active";
      uVar3 = 0x244;
    }
    else {
      if (uVar5 < 3) {
        *in_rail = (uint)(uVar5 != 1);
        if (uVar5 == 1) {
          return 0;
        }
        *ind = -1;
        return 0;
      }
      pcVar4 = "three or more tri actve";
      uVar3 = 0x245;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",uVar3
           ,"ref_inflate_rail_node",pcVar4);
    uVar1 = 1;
  }
  else {
    pcVar4 = "ids";
    uVar3 = 0x23c;
LAB_00189aec:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",uVar3
           ,"ref_inflate_rail_node",(ulong)uVar1,pcVar4);
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_inflate_rail_node(REF_GRID ref_grid,
                                                REF_DICT faceids, REF_INT node,
                                                REF_BOOL *in_rail,
                                                REF_INT *ind) {
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_INT max_id = 4, n_id = 0, ids[4], i, nactive;
  *in_rail = REF_FALSE;
  *ind = REF_EMPTY;
  RSS(ref_cell_id_list_around(tri, node, max_id, &n_id, ids), "ids");
  nactive = 0;
  for (i = 0; i < n_id; i++) {
    if (ref_dict_has_key(faceids, ids[i])) {
      RSS(ref_dict_location(faceids, ids[i], ind), "faceid loc");
      nactive++;
    }
  }
  RAS(nactive > 0, "no tris active");
  RAS(nactive < 3, "three or more tri actve");
  *in_rail = (nactive > 1);
  if (*in_rail) *ind = REF_EMPTY;
  return REF_SUCCESS;
}